

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float128_to_float32_x86_64(float128 a,float_status *status)

{
  float32 fVar1;
  uint32_t zSig;
  ulong uVar2;
  uint64_t aSig1;
  uint64_t uVar3;
  uint uVar4;
  int iVar5;
  
  uVar2 = a.high;
  uVar3 = a.low;
  uVar4 = a.high._6_2_ & 0x7fff;
  iVar5 = a.high._4_4_ >> 0x1f;
  if (uVar4 != 0x7fff) {
    uVar2 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x3ffff) != (undefined1  [16])0x0 ||
                   uVar3 != 0) | (uVar2 & 0xffffffffffff) >> 0x12;
    zSig = (uint)uVar2 | 0x40000000;
    iVar5 = uVar4 - 0x3f81;
    if (uVar2 == 0 &&
        ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      iVar5 = 0;
      zSig = 0;
    }
    fVar1 = roundAndPackFloat32(a.high._7_1_ >> 7,iVar5,zSig,status);
    return fVar1;
  }
  if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
      uVar3 == 0) {
    return iVar5 * -0x80000000 | 0x7f800000;
  }
  if (((uVar2 & 0x7fff800000000000) == 0x7fff000000000000) &&
     (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
      uVar3 != 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  fVar1 = iVar5 * -0x80000000 + 0x7f800000 + ((uint)(uVar2 >> 0x19) & 0x7fffff);
  if ((uVar2 >> 0x19 & 0x7fffff) == 0) {
    fVar1 = 0xffc00000;
  }
  if (status->default_nan_mode != '\0') {
    fVar1 = 0xffc00000;
  }
  return fVar1;
}

Assistant:

float32 float128_to_float32(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;
    uint32_t zSig;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloat32(float128ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    aSig0 |= ( aSig1 != 0 );
    shift64RightJamming( aSig0, 18, &aSig0 );
    zSig = aSig0;
    if ( aExp || zSig ) {
        zSig |= 0x40000000;
        aExp -= 0x3F81;
    }
    return roundAndPackFloat32(aSign, aExp, zSig, status);

}